

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

void cupdlp_diffDotDiff(CUPDLPwork *w,cupdlp_float *x1,cupdlp_float *x2,cupdlp_float *y1,
                       cupdlp_float *y2,cupdlp_int len,cupdlp_float *res)

{
  CUPDLPwork *w_00;
  
  memcpy(w->buffer2,x1,(long)len * 8);
  AddToVector(w->buffer2,-1.0,x2,len);
  memcpy(w->buffer3,y1,(long)len * 8);
  w_00 = (CUPDLPwork *)w->buffer3;
  AddToVector((cupdlp_float *)w_00,-1.0,y2,len);
  cupdlp_dot(w_00,len,w->buffer2,w->buffer3,res);
  return;
}

Assistant:

void cupdlp_diffDotDiff(CUPDLPwork *w, const cupdlp_float *x1,
                        const cupdlp_float *x2, const cupdlp_float *y1,
                        const cupdlp_float *y2, const cupdlp_int len,
                        cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x1, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, x2, w->buffer2);
  CUPDLP_COPY_VEC(w->buffer3, y1, cupdlp_float, len);
  cupdlp_axpy(w, len, &alpha, y2, w->buffer3);
  // reduce step
  cupdlp_dot(w, len, w->buffer2, w->buffer3, res);
}